

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O2

void __thiscall
Assimp::PLYImporter::LoadMaterial
          (PLYImporter *this,vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pvOut,
          string *defaultTexture,bool pointsOnly)

{
  DOM *pDVar1;
  aiMaterial *paVar2;
  PropertyInstance *pPVar3;
  undefined7 in_register_00000009;
  char *pKey;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  EDataType EVar7;
  pointer pPVar8;
  pointer avList;
  pointer pEVar9;
  float fVar10;
  aiMaterial *pcHelper;
  uint local_540;
  undefined4 local_53c;
  int iMode;
  allocator<char> local_531;
  EDataType local_530;
  EDataType local_52c;
  EDataType local_528;
  uint local_524;
  EDataType local_520;
  uint local_51c;
  EDataType local_518;
  EDataType local_514;
  EDataType local_510;
  uint local_50c;
  EDataType local_508;
  uint local_504;
  EDataType local_500;
  EDataType local_4fc;
  EDataType local_4f8;
  EDataType local_4f4;
  uint local_4f0;
  int two_sided;
  pointer local_4e8;
  string *local_4e0;
  undefined1 local_4d8 [8];
  undefined8 uStack_4d0;
  undefined1 local_4c8 [8];
  undefined8 uStack_4c0;
  undefined1 local_4b8 [8];
  undefined8 uStack_4b0;
  uint local_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint local_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint local_488;
  uint uStack_484;
  uint uStack_480;
  uint uStack_47c;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *local_478;
  pointer local_470;
  aiColor4D clrOut;
  void *local_458;
  ulong local_450;
  ai_real fOpacity;
  undefined1 local_430 [1024];
  
  local_53c = (undefined4)CONCAT71(in_register_00000009,pointsOnly);
  local_478 = pvOut;
  if (pvOut == (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)0x0) {
    __assert_fail("__null != pvOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyLoader.cpp"
                  ,0x2d5,
                  "void Assimp::PLYImporter::LoadMaterial(std::vector<aiMaterial *> *, std::string &, const bool)"
                 );
  }
  local_488 = 0xffffffff;
  uStack_484 = 0xffffffff;
  uStack_480 = 0xffffffff;
  uStack_47c = 0xffffffff;
  local_498 = 0xffffffff;
  uStack_494 = 0xffffffff;
  uStack_490 = 0xffffffff;
  uStack_48c = 0xffffffff;
  local_4a8 = 0xffffffff;
  uStack_4a4 = 0xffffffff;
  uStack_4a0 = 0xffffffff;
  uStack_49c = 0xffffffff;
  _local_4b8 = (undefined1  [16])0x0;
  _local_4c8 = (undefined1  [16])0x0;
  _local_4d8 = (undefined1  [16])0x0;
  pDVar1 = this->pcDOM;
  pEVar9 = (pDVar1->alElements).
           super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  do {
    if (pEVar9 == (pDVar1->alElements).
                  super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
                  _M_impl.super__Vector_impl_data._M_finish) goto LAB_0046b410;
    if (pEVar9->eSemantic == EEST_TextureFile) {
      std::__cxx11::string::_M_assign((string *)defaultTexture);
      pDVar1 = this->pcDOM;
    }
    else if (pEVar9->eSemantic == EEST_Material) {
      local_470 = (pDVar1->alElementData).
                  super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pPVar8 = (pEVar9->alProperties).
               super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uStack_4a4 = 0xffffffff;
      local_4e8 = (pointer)((ulong)local_4e8 & 0xffffffff00000000);
      local_4fc = EDT_Char;
      local_540 = 0xffffffff;
      local_500 = EDT_Char;
      local_508 = EDT_Char;
      local_510 = EDT_Char;
      local_514 = EDT_Char;
      uStack_490 = 0xffffffff;
      local_520 = EDT_Char;
      uStack_48c = 0xffffffff;
      local_528 = EDT_Char;
      local_488 = 0xffffffff;
      local_52c = EDT_Char;
      uStack_484 = 0xffffffff;
      local_530 = EDT_Char;
      uStack_480 = 0xffffffff;
      EVar7 = EDT_Char;
      uStack_47c = 0xffffffff;
      local_518 = EDT_Char;
      local_4a8 = 0xffffffff;
      local_4f4 = EDT_Char;
      local_4f8 = EDT_Char;
      uVar4 = 0;
      local_524 = local_540;
      local_51c = local_540;
      local_50c = local_540;
      local_504 = local_540;
      local_4f0 = local_540;
      for (; pPVar8 != (pEVar9->alProperties).
                       super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pPVar8 = pPVar8 + 1) {
        if (pPVar8->bIsList == false) {
          switch(pPVar8->Semantic) {
          case EST_AmbientRed:
            local_528 = pPVar8->eType;
            local_488 = uVar4;
            break;
          case EST_AmbientGreen:
            local_52c = pPVar8->eType;
            uStack_484 = uVar4;
            break;
          case EST_AmbientBlue:
            local_530 = pPVar8->eType;
            uStack_480 = uVar4;
            break;
          case EST_AmbientAlpha:
            EVar7 = pPVar8->eType;
            uStack_47c = uVar4;
            break;
          case EST_DiffuseRed:
            local_518 = pPVar8->eType;
            local_4a8 = uVar4;
            break;
          case EST_DiffuseGreen:
            local_4e8 = (pointer)CONCAT44(local_4e8._4_4_,pPVar8->eType);
            uStack_4a4 = uVar4;
            break;
          case EST_DiffuseBlue:
            local_4fc = pPVar8->eType;
            local_504 = uVar4;
            break;
          case EST_DiffuseAlpha:
            local_500 = pPVar8->eType;
            local_50c = uVar4;
            break;
          case EST_SpecularRed:
            local_508 = pPVar8->eType;
            local_51c = uVar4;
            break;
          case EST_SpecularGreen:
            local_510 = pPVar8->eType;
            local_524 = uVar4;
            break;
          case EST_SpecularBlue:
            local_514 = pPVar8->eType;
            uStack_490 = uVar4;
            break;
          case EST_SpecularAlpha:
            local_520 = pPVar8->eType;
            uStack_48c = uVar4;
            break;
          case EST_PhongPower:
            local_4f4 = pPVar8->eType;
            local_540 = uVar4;
            break;
          case EST_Opacity:
            local_4f8 = pPVar8->eType;
            local_4f0 = uVar4;
          }
        }
        uVar4 = uVar4 + 1;
      }
      uStack_4b0._0_4_ = local_530;
      uStack_4b0._4_4_ = EVar7;
      local_4b8._4_4_ = local_52c;
      local_4b8._0_4_ = local_528;
      uStack_4c0._0_4_ = local_514;
      uStack_4c0._4_4_ = local_520;
      uStack_494 = local_524;
      local_4c8._4_4_ = local_510;
      local_498 = local_51c;
      local_4c8._0_4_ = local_508;
      uStack_49c = local_50c;
      uStack_4a0 = local_504;
      uStack_4d0._0_4_ = local_4fc;
      uStack_4d0._4_4_ = local_500;
      local_4d8._4_4_ = local_4e8._0_4_;
      local_4d8._0_4_ = local_518;
      local_4e0 = defaultTexture;
      if (local_470 == (pointer)0x0) {
LAB_0046b410:
        paVar2 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(paVar2);
        iMode = 2;
        pcHelper = paVar2;
        aiMaterial::AddProperty<int>(paVar2,&iMode,1,"$mat.shadingm",0,0);
        clrOut.b = 1.0;
        clrOut.r = 1.0;
        clrOut.g = 1.0;
        aiMaterial::AddProperty<aiColor3D>(paVar2,(aiColor3D *)&clrOut,1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty<aiColor3D>(paVar2,(aiColor3D *)&clrOut,1,"$clr.specular",0,0);
        clrOut.b = 1.0;
        clrOut.r = 1.0;
        clrOut.g = 1.0;
        aiMaterial::AddProperty<aiColor3D>(paVar2,(aiColor3D *)&clrOut,1,"$clr.ambient",0,0);
        if ((char)local_53c == '\0') {
          fOpacity = 1.4013e-45;
          aiMaterial::AddProperty(paVar2,(int *)&fOpacity,1,"$mat.twosided",0,0);
        }
        if (defaultTexture->_M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_458,(defaultTexture->_M_dataplus)._M_p,
                     (allocator<char> *)&two_sided);
          sVar6 = 0x3ff;
          if ((local_450 & 0xfffffc00) == 0) {
            sVar6 = local_450 & 0xffffffff;
          }
          fOpacity = (ai_real)sVar6;
          memcpy(local_430,local_458,sVar6);
          local_430[sVar6] = 0;
          std::__cxx11::string::~string((string *)&local_458);
          aiMaterial::AddProperty(paVar2,(aiString *)&fOpacity,"$tex.file",1,0);
        }
        if ((char)local_53c != '\0') {
          fOpacity = 1.4013e-45;
          aiMaterial::AddProperty(paVar2,(int *)&fOpacity,1,"$mat.wireframe",0,0);
        }
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(local_478,&pcHelper);
      }
      else {
        local_4e8 = local_470 + uVar5;
        for (avList = *(pointer *)
                       &local_470[uVar5].alInstances.
                        super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                        ._M_impl;
            avList != *(pointer *)
                       ((long)&(local_4e8->alInstances).
                               super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                               ._M_impl + 8); avList = avList + 1) {
          clrOut.r = 0.0;
          clrOut.g = 0.0;
          clrOut.b = 0.0;
          clrOut.a = 0.0;
          paVar2 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(paVar2);
          pcHelper = paVar2;
          GetMaterialColor(&avList->alProperties,&local_4a8,(EDataType *)local_4d8,&clrOut);
          aiMaterial::AddProperty<aiColor4t<float>>(pcHelper,&clrOut,1,"$clr.diffuse",0,0);
          GetMaterialColor(&avList->alProperties,&local_498,(EDataType *)local_4c8,&clrOut);
          aiMaterial::AddProperty<aiColor4t<float>>(pcHelper,&clrOut,1,"$clr.specular",0,0);
          GetMaterialColor(&avList->alProperties,&local_488,(EDataType *)local_4b8,&clrOut);
          aiMaterial::AddProperty<aiColor4t<float>>(pcHelper,&clrOut,1,"$clr.ambient",0,0);
          iMode = 2;
          if (local_540 != 0xffffffff) {
            pPVar3 = anon_unknown.dwarf_9dafb2::GetProperty<Assimp::PLY::PropertyInstance>
                               (&avList->alProperties,local_540);
            fVar10 = PLY::PropertyInstance::ConvertTo<float>
                               (*(pPVar3->avList).
                                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                 ._M_impl.super__Vector_impl_data._M_start,local_4f4);
            if ((fVar10 != 0.0) || (NAN(fVar10))) {
              fOpacity = fVar10 * 15.0;
              aiMaterial::AddProperty<float>(pcHelper,(float *)&fOpacity,1,"$mat.shininess",0,0);
              iMode = 3;
            }
          }
          aiMaterial::AddProperty<int>(pcHelper,&iMode,1,"$mat.shadingm",0,0);
          if (local_4f0 != 0xffffffff) {
            pPVar3 = anon_unknown.dwarf_9dafb2::GetProperty<Assimp::PLY::PropertyInstance>
                               (&avList->alProperties,local_540);
            fOpacity = PLY::PropertyInstance::ConvertTo<float>
                                 (*(pPVar3->avList).
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_4f8);
            aiMaterial::AddProperty<float>(pcHelper,(float *)&fOpacity,1,"$mat.opacity",0,0);
          }
          two_sided = 1;
          aiMaterial::AddProperty(pcHelper,&two_sided,1,"$mat.twosided",0,0);
          if (local_4e0->_M_string_length != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_458,(local_4e0->_M_dataplus)._M_p,&local_531);
            sVar6 = local_450 & 0xffffffff;
            if ((local_450 & 0xfffffc00) != 0) {
              sVar6 = 0x3ff;
            }
            fOpacity = (ai_real)sVar6;
            memcpy(local_430,local_458,sVar6);
            local_430[sVar6] = 0;
            std::__cxx11::string::~string((string *)&local_458);
            aiMaterial::AddProperty(pcHelper,(aiString *)&fOpacity,"$tex.file",1,0);
          }
          if ((char)local_53c == '\0') {
            pKey = "$mat.twosided";
          }
          else {
            pKey = "$mat.wireframe";
          }
          fOpacity = 1.4013e-45;
          aiMaterial::AddProperty(pcHelper,(int *)&fOpacity,1,pKey,0,0);
          std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(local_478,&pcHelper);
        }
      }
      return;
    }
    pEVar9 = pEVar9 + 1;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void PLYImporter::LoadMaterial(std::vector<aiMaterial*>* pvOut, std::string &defaultTexture, const bool pointsOnly)
{
  ai_assert(NULL != pvOut);

  // diffuse[4], specular[4], ambient[4]
  // rgba order
  unsigned int aaiPositions[3][4] = {

    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
  };

  PLY::EDataType aaiTypes[3][4] = {
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char },
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char },
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char }
  };
  PLY::ElementInstanceList* pcList = NULL;

  unsigned int iPhong = 0xFFFFFFFF;
  PLY::EDataType ePhong = EDT_Char;

  unsigned int iOpacity = 0xFFFFFFFF;
  PLY::EDataType eOpacity = EDT_Char;

  // search in the DOM for a vertex entry
  unsigned int _i = 0;
  for (std::vector<PLY::Element>::const_iterator i = this->pcDOM->alElements.begin();
    i != this->pcDOM->alElements.end(); ++i, ++_i)
  {
    if (PLY::EEST_Material == (*i).eSemantic)
    {
      pcList = &this->pcDOM->alElementData[_i];

      // now check whether which coordinate sets are available
      unsigned int _a = 0;
      for (std::vector<PLY::Property>::const_iterator
        a = (*i).alProperties.begin();
        a != (*i).alProperties.end(); ++a, ++_a)
      {
        if ((*a).bIsList)continue;

        // pohng specularity      -----------------------------------
        if (PLY::EST_PhongPower == (*a).Semantic)
        {
          iPhong = _a;
          ePhong = (*a).eType;
        }

        // general opacity        -----------------------------------
        if (PLY::EST_Opacity == (*a).Semantic)
        {
          iOpacity = _a;
          eOpacity = (*a).eType;
        }

        // diffuse color channels -----------------------------------
        if (PLY::EST_DiffuseRed == (*a).Semantic)
        {
          aaiPositions[0][0] = _a;
          aaiTypes[0][0] = (*a).eType;
        }
        else if (PLY::EST_DiffuseGreen == (*a).Semantic)
        {
          aaiPositions[0][1] = _a;
          aaiTypes[0][1] = (*a).eType;
        }
        else if (PLY::EST_DiffuseBlue == (*a).Semantic)
        {
          aaiPositions[0][2] = _a;
          aaiTypes[0][2] = (*a).eType;
        }
        else if (PLY::EST_DiffuseAlpha == (*a).Semantic)
        {
          aaiPositions[0][3] = _a;
          aaiTypes[0][3] = (*a).eType;
        }
        // specular color channels -----------------------------------
        else if (PLY::EST_SpecularRed == (*a).Semantic)
        {
          aaiPositions[1][0] = _a;
          aaiTypes[1][0] = (*a).eType;
        }
        else if (PLY::EST_SpecularGreen == (*a).Semantic)
        {
          aaiPositions[1][1] = _a;
          aaiTypes[1][1] = (*a).eType;
        }
        else if (PLY::EST_SpecularBlue == (*a).Semantic)
        {
          aaiPositions[1][2] = _a;
          aaiTypes[1][2] = (*a).eType;
        }
        else if (PLY::EST_SpecularAlpha == (*a).Semantic)
        {
          aaiPositions[1][3] = _a;
          aaiTypes[1][3] = (*a).eType;
        }
        // ambient color channels -----------------------------------
        else if (PLY::EST_AmbientRed == (*a).Semantic)
        {
          aaiPositions[2][0] = _a;
          aaiTypes[2][0] = (*a).eType;
        }
        else if (PLY::EST_AmbientGreen == (*a).Semantic)
        {
          aaiPositions[2][1] = _a;
          aaiTypes[2][1] = (*a).eType;
        }
        else if (PLY::EST_AmbientBlue == (*a).Semantic)
        {
          aaiPositions[2][2] = _a;
          aaiTypes[2][2] = (*a).eType;
        }
        else if (PLY::EST_AmbientAlpha == (*a).Semantic)
        {
          aaiPositions[2][3] = _a;
          aaiTypes[2][3] = (*a).eType;
        }
      }
      break;
    }
    else if (PLY::EEST_TextureFile == (*i).eSemantic)
    {
      defaultTexture = (*i).szName;
    }
  }
  // check whether we have a valid source for the material data
  if (NULL != pcList) {
    for (std::vector<ElementInstance>::const_iterator i = pcList->alInstances.begin(); i != pcList->alInstances.end(); ++i)  {
      aiColor4D clrOut;
      aiMaterial* pcHelper = new aiMaterial();

      // build the diffuse material color
      GetMaterialColor((*i).alProperties, aaiPositions[0], aaiTypes[0], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_DIFFUSE);

      // build the specular material color
      GetMaterialColor((*i).alProperties, aaiPositions[1], aaiTypes[1], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_SPECULAR);

      // build the ambient material color
      GetMaterialColor((*i).alProperties, aaiPositions[2], aaiTypes[2], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_AMBIENT);

      // handle phong power and shading mode
      int iMode = (int)aiShadingMode_Gouraud;
      if (0xFFFFFFFF != iPhong)   {
        ai_real fSpec = PLY::PropertyInstance::ConvertTo<ai_real>(GetProperty((*i).alProperties, iPhong).avList.front(), ePhong);

        // if shininess is 0 (and the pow() calculation would therefore always
        // become 1, not depending on the angle), use gouraud lighting
        if (fSpec)  {
          // scale this with 15 ... hopefully this is correct
          fSpec *= 15;
          pcHelper->AddProperty<ai_real>(&fSpec, 1, AI_MATKEY_SHININESS);

          iMode = (int)aiShadingMode_Phong;
        }
      }
      pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

      // handle opacity
      if (0xFFFFFFFF != iOpacity) {
        ai_real fOpacity = PLY::PropertyInstance::ConvertTo<ai_real>(GetProperty((*i).alProperties, iPhong).avList.front(), eOpacity);
        pcHelper->AddProperty<ai_real>(&fOpacity, 1, AI_MATKEY_OPACITY);
      }

      // The face order is absolutely undefined for PLY, so we have to
      // use two-sided rendering to be sure it's ok.
      const int two_sided = 1;
      pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);

      //default texture
      if (!defaultTexture.empty())
      {
        const aiString name(defaultTexture.c_str());
        pcHelper->AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, aiTextureType_DIFFUSE, 0);
      }

      if (!pointsOnly)
      {
        const int two_sided = 1;
        pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);
      }

      //set to wireframe, so when using this material info we can switch to points rendering
      if (pointsOnly)
      {
        const int wireframe = 1;
        pcHelper->AddProperty(&wireframe, 1, AI_MATKEY_ENABLE_WIREFRAME);
      }

      // add the newly created material instance to the list
      pvOut->push_back(pcHelper);
    }
  }
  else
  {
    // generate a default material
    aiMaterial* pcHelper = new aiMaterial();

    // fill in a default material
    int iMode = (int)aiShadingMode_Gouraud;
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    //generate white material most 3D engine just multiply ambient / diffuse color with actual ambient / light color
    aiColor3D clr;
    clr.b = clr.g = clr.r = 1.0f;
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_DIFFUSE);
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_SPECULAR);

    clr.b = clr.g = clr.r = 1.0f;
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_AMBIENT);

    // The face order is absolutely undefined for PLY, so we have to
    // use two-sided rendering to be sure it's ok.
    if (!pointsOnly)
    {
      const int two_sided = 1;
      pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);
    }

    //default texture
    if (!defaultTexture.empty())
    {
      const aiString name(defaultTexture.c_str());
      pcHelper->AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, aiTextureType_DIFFUSE, 0);
    }

    //set to wireframe, so when using this material info we can switch to points rendering
    if (pointsOnly)
    {
      const int wireframe = 1;
      pcHelper->AddProperty(&wireframe, 1, AI_MATKEY_ENABLE_WIREFRAME);
    }

    pvOut->push_back(pcHelper);
  }
}